

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall
soplex::CLUFactor<double>::factor
          (CLUFactor<double> *this,SVectorBase<double> **vec,double threshold,double eps)

{
  int iVar1;
  CLUFactor<double> *in_RDI;
  CLUFactor<double> *in_XMM1_Qa;
  CLUFactor<double> *unaff_retaddr;
  CLUFactor<double> *in_stack_00000030;
  CLUFactor<double> *in_stack_00000070;
  double in_stack_00000080;
  SVectorBase<double> **in_stack_00000088;
  CLUFactor<double> *in_stack_00000090;
  
  (*in_RDI->factorTime->_vptr_Timer[3])();
  in_RDI->stat = OK;
  *(in_RDI->l).start = 0;
  (in_RDI->l).firstUpdate = 0;
  (in_RDI->l).firstUnused = 0;
  Temp::init(&in_RDI->temp,(EVP_PKEY_CTX *)(ulong)(uint)in_RDI->thedim);
  initPerm(in_RDI);
  initFactorMatrix(in_stack_00000090,in_stack_00000088,in_stack_00000080);
  if ((((in_RDI->stat == OK) && (colSingletons(in_stack_00000030), in_RDI->stat == OK)) &&
      (rowSingletons(in_stack_00000030), in_RDI->stat == OK)) &&
     ((in_RDI->temp).stage < in_RDI->thedim)) {
    initFactorRings(unaff_retaddr);
    eliminateNucleus((CLUFactor<double> *)threshold,eps,(double)unaff_retaddr);
    freeFactorRings(in_XMM1_Qa);
  }
  (in_RDI->l).firstUpdate = (in_RDI->l).firstUnused;
  if (in_RDI->stat == OK) {
    setupRowVals(in_stack_00000070);
    iVar1 = setupColVals(in_stack_00000030);
    in_RDI->nzCnt = iVar1;
  }
  (*in_RDI->factorTime->_vptr_Timer[4])();
  in_RDI->factorCount = in_RDI->factorCount + 1;
  return;
}

Assistant:

void CLUFactor<R>::factor(const SVectorBase<R>**
                          vec,          ///< Array of column VectorBase<R> pointers
                          R            threshold,    ///< pivoting threshold
                          R            eps)          ///< epsilon for zero detection
{

   factorTime->start();

   this->stat = SLinSolver<R>::OK;

   l.start[0]    = 0;
   l.firstUpdate = 0;
   l.firstUnused = 0;

   temp.init(thedim);
   initPerm();

   initFactorMatrix(vec, eps);

   if(this->stat)
      goto TERMINATE;

   //   initMaxabs = initMaxabs;

   colSingletons();

   if(this->stat != SLinSolver<R>::OK)
      goto TERMINATE;

   rowSingletons();

   if(this->stat != SLinSolver<R>::OK)
      goto TERMINATE;

   if(temp.stage < thedim)
   {
      initFactorRings();
      eliminateNucleus(eps, threshold);
      freeFactorRings();
   }

TERMINATE:

   l.firstUpdate = l.firstUnused;

   if(this->stat == SLinSolver<R>::OK)
   {
#ifdef SOPLEX_WITH_L_ROWS
      setupRowVals();
#endif
      nzCnt = setupColVals();
   }

   factorTime->stop();

   factorCount++;
}